

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.c
# Opt level: O0

size_t find_atom(pExecutor exec,char *name)

{
  int iVar1;
  pExecutor pEStack_30;
  int res;
  size_t found;
  char *copy;
  char *name_local;
  pExecutor exec_local;
  
  copy = name;
  name_local = (char *)exec;
  found = (size_t)normalize_name(name);
  iVar1 = find_place_for_atom((pExecutor)name_local,(char *)found,(size_t *)&stack0xffffffffffffffd0
                             );
  free((void *)found);
  if (iVar1 == 1) {
    exec_local = pEStack_30;
  }
  else {
    exec_local = (pExecutor)0x7ffffffe;
  }
  return (size_t)exec_local;
}

Assistant:

size_t find_atom(pExecutor exec, char *name)
{
    // Create name copy
    char *copy = normalize_name(name);
    size_t found;
    int res = find_place_for_atom(exec, copy, &found);
    free(copy);
    if (res != FIND_PLACE_EXISTS)
        return EXPR_NOT_FOUND;
    return found;
}